

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_class(Parser *this)

{
  string *__rhs;
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  query_tokenizer(this);
  poVar2 = std::operator<<((ostream *)this->out_file,"<class>");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"IDENTIFIER",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"class keyword",&local_72);
  check_token_type_x_after_y(this,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  poVar2 = (ostream *)this->out_file;
  __rhs = &this->cur_token;
  std::operator+(&local_50,"\t<identifier>",__rhs);
  std::operator+(&local_70,&local_50,"</identifier>");
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  Tokenizer::add_type(this->tokenizer,__rhs);
  std::__cxx11::string::_M_assign((string *)&this->class_name);
  query_tokenizer(this);
  Tokenizer::get_current_token_abi_cxx11_(&local_70,this->tokenizer);
  bVar1 = std::operator==(&local_70,"{");
  std::__cxx11::string::~string((string *)&local_70);
  if (!bVar1) {
    Tokenizer::get_current_token_abi_cxx11_(&local_50,this->tokenizer);
    std::operator+(&local_70,"Compiler Error: expected { instead of the token \'",&local_50);
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_70);
    poVar2 = std::operator<<(poVar2,"\'");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    goto LAB_001318db;
  }
  poVar2 = (ostream *)this->out_file;
  std::operator+(&local_50,"\t<symbol>",__rhs);
  std::operator+(&local_70,&local_50,"</symbol>");
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  do {
    query_tokenizer(this);
LAB_001318db:
    Tokenizer::get_current_token_abi_cxx11_(&local_70,this->tokenizer);
    bVar1 = std::operator==(&local_70,"static");
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      Tokenizer::get_current_token_abi_cxx11_(&local_50,this->tokenizer);
      bVar1 = std::operator==(&local_50,"field");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (!bVar1) {
        do {
          bVar1 = std::operator==(__rhs,"constructor");
          if (!bVar1) {
            bVar1 = std::operator==(__rhs,"function");
            if (!bVar1) {
              bVar1 = std::operator==(__rhs,"method");
              if (!bVar1) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_70,"}",&local_71);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_50,"class definition",&local_72);
                check_expected_x_after_y(this,&local_70,&local_50);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_70);
                poVar2 = std::operator<<((ostream *)this->out_file,"</class>");
                std::endl<char,std::char_traits<char>>(poVar2);
                query_tokenizer(this);
                while( true ) {
                  bVar1 = std::operator==(__rhs,"function");
                  if (!bVar1) break;
                  std::__cxx11::string::assign((char *)&this->cur_subroutine_type);
                  query_tokenizer(this);
                  Symbol_Table::start_subroutine(&this->symbol_table);
                  parse_subroutine(this);
                }
                Symbol_Table::free_class(&this->symbol_table);
                return;
              }
            }
          }
          std::__cxx11::string::_M_assign((string *)&this->cur_subroutine_type);
          query_tokenizer(this);
          parse_subroutine(this);
        } while( true );
      }
    }
    parse_class_var_dec(this);
  } while( true );
}

Assistant:

void Parser::parse_class() {
    // skip class declaration
    query_tokenizer();

    out_file << "<class>" << std::endl;

    check_token_type_x_after_y("IDENTIFIER", "class keyword");
    out_file << "\t<identifier>" + cur_token + "</identifier>" << std::endl;
    tokenizer.add_type(cur_token);
    class_name = cur_token;
    query_tokenizer();

    if (tokenizer.get_current_token() == "{") {
        out_file << "\t<symbol>" + cur_token + "</symbol>" << std::endl;
        query_tokenizer();
    }
    else {
        std::cerr << "Compiler Error: expected { instead of the token '" +
        tokenizer.get_current_token() <<"'" <<std::endl;
    }

    while(tokenizer.get_current_token() == "static" || tokenizer.get_current_token() == "field"){
        parse_class_var_dec();
        query_tokenizer();
    }

    while (cur_token == "constructor"  || cur_token == "function" || cur_token == "method") {
        cur_subroutine_type = cur_token;
        query_tokenizer();
        parse_subroutine();
    }

    check_expected_x_after_y("}", "class definition");
    out_file << "</class>" << std::endl;
    query_tokenizer();

    while (cur_token == "function") {
        cur_subroutine_type = "function";
        query_tokenizer();
        symbol_table.start_subroutine();
        parse_subroutine();
    }

    symbol_table.free_class();
}